

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.hpp
# Opt level: O1

patch_op duckdb_yyjson::patch_op_get(yyjson_val *op)

{
  int *piVar1;
  patch_op pVar2;
  ulong uVar3;
  
  uVar3 = op->tag >> 8;
  pVar2 = PATCH_OP_NONE;
  if (uVar3 - 3 < 5) {
    piVar1 = (int *)(op->uni).str;
    switch(uVar3) {
    case 3:
      pVar2 = PATCH_OP_NONE;
      if (*(char *)((long)piVar1 + 2) == 'd' && (short)*piVar1 == 0x6461) {
        pVar2 = PATCH_OP_ADD;
      }
      return pVar2;
    case 4:
      if (*piVar1 == 0x65766f6d) {
        return PATCH_OP_MOVE;
      }
      if (*piVar1 != 0x79706f63) {
        return (*piVar1 != 0x74736574) + PATCH_OP_TEST;
      }
      return PATCH_OP_COPY;
    case 6:
      return (uint)((short)piVar1[1] != 0x6576 || *piVar1 != 0x6f6d6572) * 5 + PATCH_OP_REMOVE;
    case 7:
      pVar2 = (uint)(*(int *)((long)piVar1 + 3) != 0x6563616c || *piVar1 != 0x6c706572) * 4 +
              PATCH_OP_REPLACE;
    }
  }
  return pVar2;
}

Assistant:

yyjson_api_inline size_t unsafe_yyjson_get_len(void *val) {
    return (size_t)(((yyjson_val *)val)->tag >> YYJSON_TAG_BIT);
}